

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

RangeValue __thiscall CoreML::RangeValue::operator/(RangeValue *this,size_t other)

{
  ostream *poVar1;
  runtime_error *this_00;
  RangeValue *extraout_RAX;
  RangeValue RVar2;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  ulong local_28;
  size_t other_local;
  RangeValue *this_local;
  RangeValue retval;
  
  local_28 = other;
  other_local = (size_t)this;
  RangeValue((RangeValue *)&this_local);
  if ((this->_isUnbound & 1U) == 0) {
    if (local_28 == 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar1 = std::operator<<(local_1a0,"Dividing range ");
      poVar1 = ::operator<<(poVar1,this);
      std::operator<<(poVar1," by 0.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(this_00,local_1e0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    set((RangeValue *)&this_local,this->_val / local_28);
    this = extraout_RAX;
  }
  RVar2._1_7_ = (undefined7)((ulong)this >> 8);
  RVar2._isUnbound = (bool)this_local._0_1_;
  RVar2._val = retval._0_8_;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator/ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound) {
        if (other == 0) {
            std::stringstream ss;
            ss << "Dividing range " << *this << " by 0.";
            throw std::runtime_error(ss.str());
        }
        retval.set(_val / other);
    }
    return retval;
}